

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void cmGlobalNinjaMultiGenerator::GetDocumentation(cmDocumentationEntry *entry)

{
  size_type __dnew;
  long local_48;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  local_48 = 0x12;
  local_40 = local_30;
  local_40 = (long *)std::__cxx11::string::_M_create((ulong *)&local_40,(ulong)&local_48);
  local_30[0] = local_48;
  *local_40 = 0x754d20616a6e694e;
  local_40[1] = 0x666e6f432d69746c;
  *(undefined2 *)(local_40 + 2) = 0x6769;
  local_38 = local_48;
  *(char *)((long)local_40 + local_48) = '\0';
  std::__cxx11::string::operator=((string *)entry,(string *)&local_40);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&entry->Brief,0,(char *)(entry->Brief)._M_string_length,0x7aa900);
  return;
}

Assistant:

void cmGlobalNinjaMultiGenerator::GetDocumentation(cmDocumentationEntry& entry)
{
  entry.Name = cmGlobalNinjaMultiGenerator::GetActualName();
  entry.Brief = "Generates build-<Config>.ninja files.";
}